

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O3

xmlSchemaAnnotPtr xmlSchemaParseAnnotation(xmlSchemaParserCtxtPtr ctxt,xmlNodePtr node,int needed)

{
  _xmlAttr *p_Var1;
  bool bVar2;
  undefined1 auVar3 [16];
  int iVar4;
  xmlNs *pxVar6;
  long lVar7;
  xmlSchemaTypePtr attr;
  xmlSchemaTypePtr in_RCX;
  undefined4 in_register_00000014;
  ulong extraout_RDX;
  xmlSchemaBasicItemPtr extraout_RDX_00;
  xmlSchemaBasicItemPtr extraout_RDX_01;
  xmlSchemaBasicItemPtr extraout_RDX_02;
  xmlSchemaBasicItemPtr extraout_RDX_03;
  xmlSchemaBasicItemPtr extraout_RDX_04;
  xmlSchemaBasicItemPtr extraout_RDX_05;
  xmlSchemaBasicItemPtr extraout_RDX_06;
  xmlSchemaBasicItemPtr pxVar8;
  long lVar9;
  xmlSchemaAnnotPtr pxVar10;
  char *str2;
  xmlChar *str1;
  char *in_R8;
  char *in_R9;
  xmlSchemaTypePtr ownerElem;
  undefined1 auVar11 [16];
  char *in_stack_ffffffffffffffb8;
  undefined8 *puVar5;
  
  auVar3._4_4_ = in_register_00000014;
  auVar3._0_4_ = needed;
  if (node == (xmlNodePtr)0x0) {
    pxVar10 = (xmlSchemaAnnotPtr)0x0;
  }
  else {
    if (needed == 0) {
      auVar3._8_8_ = 0;
      auVar11 = auVar3 << 0x40;
    }
    else {
      auVar11 = (undefined1  [16])(*xmlMalloc)(0x10);
      puVar5 = auVar11._0_8_;
      if (puVar5 == (undefined8 *)0x0) {
        if (ctxt != (xmlSchemaParserCtxtPtr)0x0) {
          ctxt->nberrors = ctxt->nberrors + 1;
        }
        in_R8 = "allocating annotation";
        in_RCX = (xmlSchemaTypePtr)0x0;
        __xmlSimpleError(0x10,2,node,(char *)0x0,"allocating annotation");
        auVar11._8_8_ = 0;
        auVar11._0_8_ = extraout_RDX;
        auVar11 = auVar11 << 0x40;
      }
      else {
        *puVar5 = 0;
        puVar5[1] = node;
      }
    }
    pxVar8 = auVar11._8_8_;
    pxVar10 = auVar11._0_8_;
    for (p_Var1 = node->properties; p_Var1 != (_xmlAttr *)0x0; p_Var1 = p_Var1->next) {
      pxVar6 = p_Var1->ns;
      if (pxVar6 == (xmlNs *)0x0) {
        iVar4 = xmlStrEqual(p_Var1->name,"id");
        pxVar8 = extraout_RDX_01;
        if (iVar4 == 0) goto LAB_001b298c;
        pxVar6 = p_Var1->ns;
        if (pxVar6 != (xmlNs *)0x0) goto LAB_001b295f;
      }
      else {
LAB_001b295f:
        iVar4 = xmlStrEqual(pxVar6->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema");
        pxVar8 = extraout_RDX_00;
        if (iVar4 != 0) {
LAB_001b298c:
          xmlSchemaPIllegalAttrErr(ctxt,(xmlParserErrors)p_Var1,pxVar8,(xmlAttrPtr)in_RCX);
          pxVar8 = extraout_RDX_02;
        }
      }
    }
    xmlSchemaPValAttrID(ctxt,node,(xmlChar *)pxVar8);
    ownerElem = (xmlSchemaTypePtr)node->children;
    if (ownerElem != (xmlSchemaTypePtr)0x0) {
      bVar2 = false;
      do {
        if (ownerElem->node == (xmlNodePtr)0x0) {
LAB_001b2b52:
          if (!bVar2) {
            in_R8 = (char *)0x0;
            in_R9 = "(appinfo | documentation)*";
            in_RCX = ownerElem;
            xmlSchemaPContentErr
                      (ctxt,XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED,(xmlSchemaBasicItemPtr)node,
                       (xmlNodePtr)ownerElem,(xmlNodePtr)0x0,"(appinfo | documentation)*",
                       in_stack_ffffffffffffffb8);
          }
          bVar2 = true;
        }
        else {
          iVar4 = xmlStrEqual(ownerElem->name,(xmlChar *)"appinfo");
          if ((iVar4 == 0) ||
             (iVar4 = xmlStrEqual(ownerElem->node->name,
                                  (xmlChar *)"http://www.w3.org/2001/XMLSchema"), iVar4 == 0)) {
            if ((ownerElem->node == (xmlNodePtr)0x0) ||
               ((iVar4 = xmlStrEqual(ownerElem->name,(xmlChar *)"documentation"), iVar4 == 0 ||
                (iVar4 = xmlStrEqual(ownerElem->node->name,
                                     (xmlChar *)"http://www.w3.org/2001/XMLSchema"), iVar4 == 0))))
            goto LAB_001b2b52;
            lVar7._0_4_ = ownerElem->flags;
            lVar7._4_4_ = ownerElem->contentType;
            if (lVar7 != 0) {
              do {
                if (*(long *)(lVar7 + 0x48) == 0) {
                  str1 = *(xmlChar **)(lVar7 + 0x10);
                  str2 = "source";
LAB_001b2aee:
                  iVar4 = xmlStrEqual(str1,(xmlChar *)str2);
                  pxVar8 = extraout_RDX_06;
                  if (iVar4 == 0) {
LAB_001b2af7:
                    xmlSchemaPIllegalAttrErr(ctxt,(xmlParserErrors)lVar7,pxVar8,(xmlAttrPtr)in_RCX);
                  }
                }
                else {
                  iVar4 = xmlStrEqual(*(xmlChar **)(*(long *)(lVar7 + 0x48) + 0x10),
                                      (xmlChar *)"http://www.w3.org/2001/XMLSchema");
                  pxVar8 = extraout_RDX_05;
                  if (iVar4 != 0) goto LAB_001b2af7;
                  iVar4 = xmlStrEqual(*(xmlChar **)(lVar7 + 0x10),"lang");
                  if (iVar4 != 0) {
                    str1 = *(xmlChar **)(*(long *)(lVar7 + 0x48) + 0x10);
                    str2 = "http://www.w3.org/XML/1998/namespace";
                    goto LAB_001b2aee;
                  }
                }
                lVar7 = *(long *)(lVar7 + 0x30);
              } while (lVar7 != 0);
              for (pxVar8 = *(xmlSchemaBasicItemPtr *)&ownerElem->flags;
                  pxVar8 != (xmlSchemaBasicItemPtr)0x0;
                  pxVar8 = *(xmlSchemaBasicItemPtr *)(pxVar8 + 3)) {
                if (((pxVar8[4].dummy != (void *)0x0) &&
                    (iVar4 = xmlStrEqual(*(xmlChar **)(pxVar8 + 1),"lang"), iVar4 != 0)) &&
                   (iVar4 = xmlStrEqual(*(xmlChar **)((long)pxVar8[4].dummy + 0x10),
                                        (xmlChar *)"http://www.w3.org/XML/1998/namespace"),
                   iVar4 != 0)) {
                  attr = xmlSchemaGetBuiltInType(XML_SCHEMAS_LANGUAGE);
                  in_RCX = (xmlSchemaTypePtr)0x0;
                  xmlSchemaPValAttrNode
                            (ctxt,pxVar8,(xmlAttrPtr)attr,(xmlSchemaTypePtr)0x0,(xmlChar **)in_R8);
                  break;
                }
              }
            }
          }
          else {
            lVar9._0_4_ = ownerElem->flags;
            lVar9._4_4_ = ownerElem->contentType;
            for (; lVar9 != 0; lVar9 = *(long *)(lVar9 + 0x30)) {
              lVar7 = *(long *)(lVar9 + 0x48);
              if (lVar7 == 0) {
                iVar4 = xmlStrEqual(*(xmlChar **)(lVar9 + 0x10),"source");
                pxVar8 = extraout_RDX_04;
                if (iVar4 == 0) goto LAB_001b2a4c;
                lVar7 = *(long *)(lVar9 + 0x48);
                if (lVar7 != 0) goto LAB_001b2a1f;
              }
              else {
LAB_001b2a1f:
                iVar4 = xmlStrEqual(*(xmlChar **)(lVar7 + 0x10),
                                    (xmlChar *)"http://www.w3.org/2001/XMLSchema");
                pxVar8 = extraout_RDX_03;
                if (iVar4 != 0) {
LAB_001b2a4c:
                  xmlSchemaPIllegalAttrErr(ctxt,(xmlParserErrors)lVar9,pxVar8,(xmlAttrPtr)in_RCX);
                }
              }
            }
            in_RCX = xmlSchemaGetBuiltInType(XML_SCHEMAS_ANYURI);
            in_R8 = (char *)0x0;
            xmlSchemaPValAttr(ctxt,(xmlSchemaBasicItemPtr)ownerElem,(xmlNodePtr)0x1f8556,
                              (char *)in_RCX,(xmlSchemaTypePtr)0x0,(xmlChar **)in_R9);
          }
        }
        ownerElem = (xmlSchemaTypePtr)ownerElem->annot;
      } while (ownerElem != (xmlSchemaTypePtr)0x0);
    }
  }
  return pxVar10;
}

Assistant:

static xmlSchemaAnnotPtr
xmlSchemaParseAnnotation(xmlSchemaParserCtxtPtr ctxt, xmlNodePtr node, int needed)
{
    xmlSchemaAnnotPtr ret;
    xmlNodePtr child = NULL;
    xmlAttrPtr attr;
    int barked = 0;

    /*
    * INFO: S4S completed.
    */
    /*
    * id = ID
    * {any attributes with non-schema namespace . . .}>
    * Content: (appinfo | documentation)*
    */
    if ((ctxt == NULL) || (node == NULL))
        return (NULL);
    if (needed)
	ret = xmlSchemaNewAnnot(ctxt, node);
    else
	ret = NULL;
    attr = node->properties;
    while (attr != NULL) {
	if (((attr->ns == NULL) &&
	    (!xmlStrEqual(attr->name, BAD_CAST "id"))) ||
	    ((attr->ns != NULL) &&
	    xmlStrEqual(attr->ns->href, xmlSchemaNs))) {

	    xmlSchemaPIllegalAttrErr(ctxt,
		XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED, NULL, attr);
	}
	attr = attr->next;
    }
    xmlSchemaPValAttrID(ctxt, node, BAD_CAST "id");
    /*
    * And now for the children...
    */
    child = node->children;
    while (child != NULL) {
	if (IS_SCHEMA(child, "appinfo")) {
	    /* TODO: make available the content of "appinfo". */
	    /*
	    * source = anyURI
	    * {any attributes with non-schema namespace . . .}>
	    * Content: ({any})*
	    */
	    attr = child->properties;
	    while (attr != NULL) {
		if (((attr->ns == NULL) &&
		     (!xmlStrEqual(attr->name, BAD_CAST "source"))) ||
		     ((attr->ns != NULL) &&
		      xmlStrEqual(attr->ns->href, xmlSchemaNs))) {

		    xmlSchemaPIllegalAttrErr(ctxt,
			XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED, NULL, attr);
		}
		attr = attr->next;
	    }
	    xmlSchemaPValAttr(ctxt, NULL, child, "source",
		xmlSchemaGetBuiltInType(XML_SCHEMAS_ANYURI), NULL);
	    child = child->next;
	} else if (IS_SCHEMA(child, "documentation")) {
	    /* TODO: make available the content of "documentation". */
	    /*
	    * source = anyURI
	    * {any attributes with non-schema namespace . . .}>
	    * Content: ({any})*
	    */
	    attr = child->properties;
	    while (attr != NULL) {
		if (attr->ns == NULL) {
		    if (!xmlStrEqual(attr->name, BAD_CAST "source")) {
			xmlSchemaPIllegalAttrErr(ctxt,
			    XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED, NULL, attr);
		    }
		} else {
		    if (xmlStrEqual(attr->ns->href, xmlSchemaNs) ||
			(xmlStrEqual(attr->name, BAD_CAST "lang") &&
			(!xmlStrEqual(attr->ns->href, XML_XML_NAMESPACE)))) {

			xmlSchemaPIllegalAttrErr(ctxt,
			    XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED, NULL, attr);
		    }
		}
		attr = attr->next;
	    }
	    /*
	    * Attribute "xml:lang".
	    */
	    attr = xmlSchemaGetPropNodeNs(child, (const char *) XML_XML_NAMESPACE, "lang");
	    if (attr != NULL)
		xmlSchemaPValAttrNode(ctxt, NULL, attr,
		xmlSchemaGetBuiltInType(XML_SCHEMAS_LANGUAGE), NULL);
	    child = child->next;
	} else {
	    if (!barked)
		xmlSchemaPContentErr(ctxt,
		    XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED,
		    NULL, node, child, NULL, "(appinfo | documentation)*");
	    barked = 1;
	    child = child->next;
	}
    }

    return (ret);
}